

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

void smf_track_remove_from_smf(smf_track_t *track)

{
  smf_track_t *track_00;
  smf_event_t *psVar1;
  smf_event_t *ev;
  smf_track_t *tmp;
  int j;
  int i;
  smf_track_t *track_local;
  
  if (track->smf == (smf_t *)0x0) {
    __assert_fail("track->smf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0xb3,"void smf_track_remove_from_smf(smf_track_t *)");
  }
  track->smf->number_of_tracks = track->smf->number_of_tracks + -1;
  if (track->smf->tracks_array != (GPtrArray *)0x0) {
    g_ptr_array_remove(track->smf->tracks_array,track);
    for (tmp._4_4_ = track->track_number; tmp._4_4_ <= track->smf->number_of_tracks;
        tmp._4_4_ = tmp._4_4_ + 1) {
      track_00 = smf_get_track_by_number(track->smf,tmp._4_4_);
      track_00->track_number = tmp._4_4_;
      for (tmp._0_4_ = 1; (int)tmp <= track_00->number_of_events; tmp._0_4_ = (int)tmp + 1) {
        psVar1 = smf_track_get_event_by_number(track_00,(int)tmp);
        psVar1->track_number = tmp._4_4_;
      }
    }
    track->track_number = -1;
    track->smf = (smf_t *)0x0;
    return;
  }
  __assert_fail("track->smf->tracks_array",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0xb7,"void smf_track_remove_from_smf(smf_track_t *)");
}

Assistant:

void
smf_track_remove_from_smf(smf_track_t *track)
{
	int i, j;
	smf_track_t *tmp;
	smf_event_t *ev;

	assert(track->smf != NULL);

	track->smf->number_of_tracks--;

	assert(track->smf->tracks_array);
	g_ptr_array_remove(track->smf->tracks_array, track);

	/* Renumber the rest of the tracks, so they are consecutively numbered. */
	for (i = track->track_number; i <= track->smf->number_of_tracks; i++) {
		tmp = smf_get_track_by_number(track->smf, i);
		tmp->track_number = i;

		/*
		 * Events have track numbers too.  I guess this wasn't a wise
		 * decision.  ;-/
		 */
		for (j = 1; j <= tmp->number_of_events; j++) {
			ev = smf_track_get_event_by_number(tmp, j);
			ev->track_number = i;
		}
	}

	track->track_number = -1;
	track->smf = NULL;
}